

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

size_t __thiscall
wasm::LEB<unsigned_int,_unsigned_char>::writeAt
          (LEB<unsigned_int,_unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out,size_t at,size_t minimum)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  bool bVar4;
  
  sVar1 = 0;
  uVar3 = this->value;
  do {
    sVar2 = sVar1 + 1;
    bVar4 = sVar2 < minimum || 0x7f < uVar3;
    (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[sVar1 + at] = bVar4 << 7 | (byte)uVar3 & 0x7f;
    sVar1 = sVar2;
    uVar3 = uVar3 >> 7;
  } while (bVar4);
  return sVar2;
}

Assistant:

size_t writeAt(std::vector<uint8_t>* out, size_t at, size_t minimum = 0) {
    T temp = value;
    size_t offset = 0;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte) || offset + 1 < minimum;
      if (more) {
        byte = byte | 128;
      }
      (*out)[at + offset] = byte;
      offset++;
    } while (more);
    return offset;
  }